

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

bool __thiscall Time::Time::fromDate(Time *this,char *_date)

{
  int iVar1;
  time_t tVar2;
  bool bVar3;
  bool local_3d1;
  bool local_3a1;
  String local_360;
  String local_350;
  String local_340;
  String local_330;
  undefined1 local_320 [8];
  String monthTxt_1;
  String local_2f8;
  byte local_2e2;
  byte local_2e1;
  String local_2e0;
  byte local_2ca;
  byte local_2c9;
  String local_2c8;
  String local_2b8;
  String local_2a8;
  String local_298;
  byte local_282;
  byte local_281;
  String local_280;
  byte local_26a;
  byte local_269;
  String local_268;
  byte local_252;
  byte local_251;
  String local_250;
  String local_240;
  String local_230;
  String local_220;
  int local_20c;
  int yearLength;
  undefined1 local_1f8 [8];
  String remain_1;
  String local_1d8;
  String local_1c8;
  String local_1b8;
  String local_1a8;
  uint local_194;
  undefined1 local_190 [8];
  String monthTxt;
  undefined1 local_170 [8];
  String remain;
  String local_150;
  String local_140;
  String local_130;
  String local_120;
  String local_110;
  byte local_fa;
  byte local_f9;
  String local_f8;
  String local_e8 [2];
  char *pcStack_c8;
  char *monthName [12];
  tm ekT;
  String date;
  char *_date_local;
  Time *this_local;
  
  Bstrlib::String::String((String *)&ekT.tm_zone,_date);
  ekT.tm_wday = 0;
  ekT.tm_yday = 0;
  ekT.tm_isdst = 0;
  ekT._36_4_ = 0;
  ekT.tm_hour = 0;
  ekT.tm_mday = 0;
  ekT.tm_mon = 0;
  ekT.tm_year = 0;
  monthName[0xb] = (char *)0x0;
  ekT.tm_sec = 0;
  ekT.tm_min = 0;
  ekT.tm_gmtoff = 0;
  monthName[9] = "Nov";
  monthName[10] = "Dec";
  monthName[7] = "Sep";
  monthName[8] = "Oct";
  monthName[5] = "Jul";
  monthName[6] = "Aug";
  monthName[3] = "May";
  monthName[4] = "Jun";
  monthName[1] = "Mar";
  monthName[2] = "Apr";
  pcStack_c8 = "Jan";
  monthName[0] = "Feb";
  local_f9 = 0;
  local_fa = 0;
  iVar1 = Bstrlib::String::Find((String *)&ekT.tm_zone,"T",0);
  bVar3 = false;
  if (7 < iVar1) {
    Bstrlib::String::String(&local_f8,"T");
    local_f9 = 1;
    Bstrlib::String::fromFirst(local_e8,(String *)&ekT.tm_zone,SUB81(&local_f8,0));
    local_fa = 1;
    iVar1 = Bstrlib::String::getLength(local_e8);
    bVar3 = 6 < iVar1;
  }
  if ((local_fa & 1) != 0) {
    Bstrlib::String::~String(local_e8);
  }
  if ((local_f9 & 1) != 0) {
    Bstrlib::String::~String(&local_f8);
  }
  if (bVar3) {
    Bstrlib::String::findAndReplace((String *)&ekT.tm_zone,"-","",0);
    Bstrlib::String::findAndReplace((String *)&ekT.tm_zone,"-","",0);
    Bstrlib::String::findAndReplace((String *)&ekT.tm_zone,"-","",0);
    Bstrlib::String::findAndReplace((String *)&ekT.tm_zone,":","",0);
    Bstrlib::String::findAndReplace((String *)&ekT.tm_zone,":","",0);
    Bstrlib::String::findAndReplace((String *)&ekT.tm_zone,":","",0);
    Bstrlib::String::midString(&local_110,(int)&ekT + 0x30,0);
    iVar1 = Bstrlib::String::operator_cast_to_int(&local_110);
    ekT.tm_mday = iVar1 + -0x76c;
    Bstrlib::String::~String(&local_110);
    Bstrlib::String::midString(&local_120,(int)&ekT + 0x30,4);
    iVar1 = Bstrlib::String::operator_cast_to_int(&local_120);
    ekT.tm_hour = iVar1 + -1;
    Bstrlib::String::~String(&local_120);
    Bstrlib::String::midString(&local_130,(int)&ekT + 0x30,6);
    iVar1 = Bstrlib::String::operator_cast_to_int(&local_130);
    ekT.tm_min = iVar1;
    Bstrlib::String::~String(&local_130);
    Bstrlib::String::midString(&local_140,(int)&ekT + 0x30,9);
    ekT.tm_sec = Bstrlib::String::operator_cast_to_int(&local_140);
    Bstrlib::String::~String(&local_140);
    Bstrlib::String::midString(&local_150,(int)&ekT + 0x30,0xb);
    iVar1 = Bstrlib::String::operator_cast_to_int(&local_150);
    monthName[0xb] = (char *)CONCAT44(iVar1,monthName[0xb]._0_4_);
    Bstrlib::String::~String(&local_150);
    Bstrlib::String::midString((String *)&remain.super_tagbstring.data,(int)&ekT + 0x30,0xd);
    iVar1 = Bstrlib::String::operator_cast_to_int((String *)&remain.super_tagbstring.data);
    monthName[0xb] = (char *)CONCAT44(monthName[0xb]._4_4_,iVar1);
    Bstrlib::String::~String((String *)&remain.super_tagbstring.data);
  }
  else {
    iVar1 = Bstrlib::String::Find((String *)&ekT.tm_zone,',',0);
    if (iVar1 == -1) {
      Bstrlib::String::String((String *)&monthTxt.super_tagbstring.data," ");
      Bstrlib::String::fromFirst
                ((String *)local_170,(String *)&ekT.tm_zone,(bool)((char)&monthTxt + '\b'));
      Bstrlib::String::~String((String *)&monthTxt.super_tagbstring.data);
      Bstrlib::String::midString((String *)local_190,(int)local_170,0);
      ekT.tm_hour = 0;
      while( true ) {
        local_3a1 = false;
        if (ekT.tm_hour < 0xc) {
          local_3a1 = Bstrlib::String::operator!=
                                ((String *)local_190,monthName[(long)ekT.tm_hour + -1]);
        }
        if (local_3a1 == false) break;
        ekT.tm_hour = ekT.tm_hour + 1;
      }
      bVar3 = ekT.tm_hour != 0xc;
      if (bVar3) {
        Bstrlib::String::midString(&local_1a8,(int)local_170,4);
        iVar1 = Bstrlib::String::operator_cast_to_int(&local_1a8);
        ekT.tm_min = iVar1;
        Bstrlib::String::~String(&local_1a8);
        Bstrlib::String::midString(&local_1b8,(int)local_170,7);
        ekT.tm_sec = Bstrlib::String::operator_cast_to_int(&local_1b8);
        Bstrlib::String::~String(&local_1b8);
        Bstrlib::String::midString(&local_1c8,(int)local_170,10);
        iVar1 = Bstrlib::String::operator_cast_to_int(&local_1c8);
        monthName[0xb] = (char *)CONCAT44(iVar1,monthName[0xb]._0_4_);
        Bstrlib::String::~String(&local_1c8);
        Bstrlib::String::midString(&local_1d8,(int)local_170,0xd);
        iVar1 = Bstrlib::String::operator_cast_to_int(&local_1d8);
        monthName[0xb] = (char *)CONCAT44(monthName[0xb]._4_4_,iVar1);
        Bstrlib::String::~String(&local_1d8);
        Bstrlib::String::midString((String *)&remain_1.super_tagbstring.data,(int)local_170,0x10);
        iVar1 = Bstrlib::String::operator_cast_to_int((String *)&remain_1.super_tagbstring.data);
        ekT.tm_mday = iVar1 + -0x76c;
        Bstrlib::String::~String((String *)&remain_1.super_tagbstring.data);
      }
      else {
        this_local._7_1_ = 0;
      }
      local_194 = (uint)!bVar3;
      Bstrlib::String::~String((String *)local_190);
      Bstrlib::String::~String((String *)local_170);
    }
    else {
      Bstrlib::String::String((String *)&stack0xfffffffffffffdf8," ");
      Bstrlib::String::fromFirst
                ((String *)local_1f8,(String *)&ekT.tm_zone,SUB81(&stack0xfffffffffffffdf8,0));
      Bstrlib::String::~String((String *)&stack0xfffffffffffffdf8);
      local_251 = 0;
      local_252 = 0;
      local_269 = 0;
      local_26a = 0;
      local_281 = 0;
      local_282 = 0;
      local_2c9 = 0;
      local_2ca = 0;
      local_2e1 = 0;
      local_2e2 = 0;
      iVar1 = Bstrlib::String::Find((String *)local_1f8,'-',0);
      if (iVar1 == -1) {
        Bstrlib::String::String(&local_2c8," ");
        local_2c9 = 1;
        Bstrlib::String::fromFirst(&local_2b8,(String *)local_1f8,SUB81(&local_2c8,0));
        local_2ca = 1;
        Bstrlib::String::String(&local_2e0," ");
        local_2e1 = 1;
        Bstrlib::String::fromFirst(&local_2a8,&local_2b8,SUB81(&local_2e0,0));
        local_2e2 = 1;
        Bstrlib::String::String(&local_2f8," ");
        Bstrlib::String::upToFirst(&local_298,&local_2a8,SUB81(&local_2f8,0));
        iVar1 = Bstrlib::String::getLength(&local_298);
        Bstrlib::String::~String(&local_298);
        Bstrlib::String::~String(&local_2f8);
      }
      else {
        Bstrlib::String::String(&local_250,"-");
        local_251 = 1;
        Bstrlib::String::fromFirst(&local_240,(String *)local_1f8,SUB81(&local_250,0));
        local_252 = 1;
        Bstrlib::String::String(&local_268,"-");
        local_269 = 1;
        Bstrlib::String::fromFirst(&local_230,&local_240,SUB81(&local_268,0));
        local_26a = 1;
        Bstrlib::String::String(&local_280," ");
        local_281 = 1;
        Bstrlib::String::upToFirst(&local_220,&local_230,SUB81(&local_280,0));
        local_282 = 1;
        iVar1 = Bstrlib::String::getLength(&local_220);
      }
      if ((local_2e2 & 1) != 0) {
        Bstrlib::String::~String(&local_2a8);
      }
      if ((local_2e1 & 1) != 0) {
        Bstrlib::String::~String(&local_2e0);
      }
      if ((local_2ca & 1) != 0) {
        Bstrlib::String::~String(&local_2b8);
      }
      if ((local_2c9 & 1) != 0) {
        Bstrlib::String::~String(&local_2c8);
      }
      if ((local_282 & 1) != 0) {
        Bstrlib::String::~String(&local_220);
      }
      if ((local_281 & 1) != 0) {
        Bstrlib::String::~String(&local_280);
      }
      if ((local_26a & 1) != 0) {
        Bstrlib::String::~String(&local_230);
      }
      if ((local_269 & 1) != 0) {
        Bstrlib::String::~String(&local_268);
      }
      if ((local_252 & 1) != 0) {
        Bstrlib::String::~String(&local_240);
      }
      if ((local_251 & 1) != 0) {
        Bstrlib::String::~String(&local_250);
      }
      local_20c = iVar1;
      Bstrlib::String::midString((String *)&monthTxt_1.super_tagbstring.data,(int)local_1f8,0);
      iVar1 = Bstrlib::String::operator_cast_to_int((String *)&monthTxt_1.super_tagbstring.data);
      ekT.tm_min = iVar1;
      Bstrlib::String::~String((String *)&monthTxt_1.super_tagbstring.data);
      Bstrlib::String::midString((String *)local_320,(int)local_1f8,3);
      ekT.tm_hour = 0;
      while( true ) {
        local_3d1 = false;
        if (ekT.tm_hour < 0xc) {
          local_3d1 = Bstrlib::String::operator!=
                                ((String *)local_320,monthName[(long)ekT.tm_hour + -1]);
        }
        if (local_3d1 == false) break;
        ekT.tm_hour = ekT.tm_hour + 1;
      }
      if (ekT.tm_hour == 0xc) {
        this_local._7_1_ = 0;
        local_194 = 1;
      }
      else {
        Bstrlib::String::midString(&local_330,(int)local_1f8,7);
        ekT.tm_mday = Bstrlib::String::operator_cast_to_int(&local_330);
        Bstrlib::String::~String(&local_330);
        if (ekT.tm_mday < 0x76d) {
          if (ekT.tm_mday < 0x46) {
            ekT.tm_mday = ekT.tm_mday + 100;
          }
        }
        else {
          ekT.tm_mday = ekT.tm_mday + -0x76c;
        }
        Bstrlib::String::midString(&local_340,(int)local_1f8,local_20c + 8);
        iVar1 = Bstrlib::String::operator_cast_to_int(&local_340);
        ekT.tm_sec = iVar1;
        Bstrlib::String::~String(&local_340);
        Bstrlib::String::midString(&local_350,(int)local_1f8,local_20c + 0xb);
        iVar1 = Bstrlib::String::operator_cast_to_int(&local_350);
        monthName[0xb] = (char *)CONCAT44(iVar1,monthName[0xb]._0_4_);
        Bstrlib::String::~String(&local_350);
        Bstrlib::String::midString(&local_360,(int)local_1f8,local_20c + 0xe);
        iVar1 = Bstrlib::String::operator_cast_to_int(&local_360);
        monthName[0xb] = (char *)CONCAT44(monthName[0xb]._4_4_,iVar1);
        Bstrlib::String::~String(&local_360);
        local_194 = 0;
      }
      Bstrlib::String::~String((String *)local_320);
      Bstrlib::String::~String((String *)local_1f8);
    }
    if (local_194 != 0) goto LAB_00122b4a;
  }
  tVar2 = timeGM((tm *)(monthName + 0xb));
  (this->timeSinceEpoch).tv_sec = tVar2;
  (this->timeSinceEpoch).tv_usec = 0;
  this_local._7_1_ = 1;
  local_194 = 1;
LAB_00122b4a:
  Bstrlib::String::~String((String *)&ekT.tm_zone);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Time::fromDate(const char * _date)
    {
#if defined(_WIN32) || defined(_POSIX)
        typedef Strings::FastString String;
        String date(_date);
        struct tm ekT = {0};

        const char * monthName[] = { "Jan", "Feb", "Mar", "Apr", "May", "Jun", "Jul", "Aug", "Sep", "Oct", "Nov", "Dec" };
        
        // Check for ISO8601 format first
        if (date.Find("T") >= 8 && date.fromFirst("T").getLength() > 6)
        {
            // Both format YYYY-MM-DDTHH:MM:SS and YYYYMMDDTHHMMSS exists and are valid
            date.findAndReplace("-", ""); date.findAndReplace("-", ""); date.findAndReplace("-", "");
            date.findAndReplace(":", ""); date.findAndReplace(":", ""); date.findAndReplace(":", "");
            
            ekT.tm_year = (int)date.midString(0, 4) - 1900;
            ekT.tm_mon = (int)date.midString(4, 2) - 1; // Month are in [0 11] range
            ekT.tm_mday = (int)date.midString(6, 2);
            ekT.tm_hour = (int)date.midString(9, 2);
            ekT.tm_min = (int)date.midString(11, 2);
            ekT.tm_sec = (int)date.midString(13, 2);
        } 
        // Try to figure out the format used (RFC1036 or RFC1123 or asctime)
        else if (date.Find(',') == -1)
        {
            // Probably asctime, so let's figure out the format now
            String remain = date.fromFirst(" ");
            String monthTxt = remain.midString(0, 3);

            for (ekT.tm_mon = 0; ekT.tm_mon < 12 && monthTxt != monthName[ekT.tm_mon]; ekT.tm_mon++);
            if (ekT.tm_mon == 12) return false;

            ekT.tm_mday = (int)remain.midString(4, 2);
            ekT.tm_hour = (int)remain.midString(7, 2);
            ekT.tm_min  = (int)remain.midString(10, 2);
            ekT.tm_sec  = (int)remain.midString(13, 2);
            ekT.tm_year = (int)remain.midString(16, 4) - 1900;
        }
        else
        {   // Either RFC 1123 or RFC 1036
            String remain = date.fromFirst(" ");
            int yearLength = remain.Find('-') != -1 ? 
                                    remain.fromFirst("-").fromFirst("-").upToFirst(" ").getLength()
                                 :  remain.fromFirst(" ").fromFirst(" ").upToFirst(" ").getLength();
            ekT.tm_mday = (int)remain.midString(0, 2);
            String monthTxt = remain.midString(3, 3);

            for (ekT.tm_mon = 0; ekT.tm_mon < 12 && monthTxt != monthName[ekT.tm_mon]; ekT.tm_mon++);
            if (ekT.tm_mon == 12) return false;

            ekT.tm_year = (int)remain.midString(7, yearLength); 
            if (ekT.tm_year > 1900) ekT.tm_year -= 1900; else if (ekT.tm_year < 70) ekT.tm_year += 100;
            ekT.tm_hour = (int)remain.midString(8 + yearLength, 2);
            ekT.tm_min  = (int)remain.midString(11 + yearLength, 2);
            ekT.tm_sec  = (int)remain.midString(14 + yearLength, 2);
        }

        timeSinceEpoch.tv_sec = timeGM(&ekT);
        timeSinceEpoch.tv_usec = 0;
        return true;
#else        
        return false;
#endif
    }